

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

int __thiscall MP1Node::introduceSelfToGroup(MP1Node *this,Address *joinaddr)

{
  Member *pMVar1;
  int iVar2;
  char *data;
  size_t msgsize;
  MessageHdr *msg;
  Address *joinaddr_local;
  MP1Node *this_local;
  
  iVar2 = memcmp(&this->memberNode->addr,joinaddr,6);
  if (iVar2 == 0) {
    Log::LOG(this->log,&this->memberNode->addr,"Starting up group...");
    this->memberNode->inGroup = true;
  }
  else {
    data = (char *)malloc(0x12);
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    pMVar1 = this->memberNode;
    *(undefined4 *)(data + 4) = *(undefined4 *)(pMVar1->addr).addr;
    *(undefined2 *)(data + 8) = *(undefined2 *)((pMVar1->addr).addr + 4);
    *(long *)(data + 10) = this->memberNode->heartbeat;
    sprintf(introduceSelfToGroup::s,"Trying to join...");
    Log::LOG(this->log,&this->memberNode->addr,introduceSelfToGroup::s);
    EmulNet::ENsend(this->emulNet,&this->memberNode->addr,joinaddr,data,0x12);
    free(data);
  }
  return 1;
}

Assistant:

int MP1Node::introduceSelfToGroup(Address *joinaddr) {
    MessageHdr *msg;
#ifdef DEBUGLOG
    static char s[1024];
#endif

    if ( 0 == memcmp((char *)&(memberNode->addr.addr), (char *)&(joinaddr->addr), sizeof(memberNode->addr.addr))) {
        // I am the group booter (first process to join the group). Boot up the group
#ifdef DEBUGLOG
        log->LOG(&memberNode->addr, "Starting up group...");
#endif
        memberNode->inGroup = true;
    }
    else {
        size_t msgsize = sizeof(MessageHdr) + sizeof(joinaddr->addr) + sizeof(long);
        msg = (MessageHdr *) malloc(msgsize * sizeof(char));

        // create JOINREQ message: format of data is {struct Address myaddr}
        msg->msgType = JOINREQ;
        memcpy((char *)(msg+1), &memberNode->addr.addr, sizeof(memberNode->addr.addr));
        memcpy((char *)(msg+1) + sizeof(memberNode->addr.addr), &memberNode->heartbeat, sizeof(long));

#ifdef DEBUGLOG
        sprintf(s, "Trying to join...");
        log->LOG(&memberNode->addr, s);
#endif

        // send JOINREQ message to introducer member
        emulNet->ENsend(&memberNode->addr, joinaddr, (char *)msg, msgsize);

        free(msg);
    }

    return 1;

}